

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.h
# Opt level: O0

void __thiscall sptk::ScalarOperation::~ScalarOperation(ScalarOperation *this)

{
  bool bVar1;
  iterator this_00;
  reference ppMVar2;
  __normal_iterator<sptk::ScalarOperation::ModuleInterface_**,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
  *in_RDI;
  iterator itr;
  vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
  *in_stack_ffffffffffffffd8;
  
  in_RDI->_M_current = (ModuleInterface **)&PTR__ScalarOperation_0012d3d8;
  this_00 = std::
            vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
            ::begin(in_stack_ffffffffffffffd8);
  while( true ) {
    std::
    vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
    ::end(in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<sptk::ScalarOperation::ModuleInterface_**,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
                               *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<sptk::ScalarOperation::ModuleInterface_**,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
              ::operator*((__normal_iterator<sptk::ScalarOperation::ModuleInterface_**,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
                           *)&stack0xfffffffffffffff0);
    in_stack_ffffffffffffffd8 =
         (vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
          *)*ppMVar2;
    if (in_stack_ffffffffffffffd8 !=
        (vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
         *)0x0) {
      (*(code *)(in_stack_ffffffffffffffd8->
                super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                )._M_impl.super__Vector_impl_data._M_start[1])();
    }
    __gnu_cxx::
    __normal_iterator<sptk::ScalarOperation::ModuleInterface_**,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
    ::operator++((__normal_iterator<sptk::ScalarOperation::ModuleInterface_**,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  std::
  vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
  ::~vector((vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
             *)this_00._M_current);
  return;
}

Assistant:

virtual ~ScalarOperation() {
    for (std::vector<ScalarOperation::ModuleInterface*>::iterator itr(
             modules_.begin());
         itr != modules_.end(); ++itr) {
      delete (*itr);
    }
  }